

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsDiurnal_FSA_kry.c
# Opt level: O3

int main(int argc,char **argv)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  UserData paVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  sunrealtype **ppsVar9;
  sunindextype *psVar10;
  sunrealtype *psVar11;
  N_Vector y;
  undefined1 (*pauVar12) [16];
  void *cvode_mem_00;
  int *piVar13;
  N_Vector *uS;
  char *pcVar14;
  undefined1 (*pauVar15) [16];
  int iVar16;
  sunindextype *(*papsVar17) [15];
  char *__format;
  long lVar18;
  long lVar19;
  double dVar20;
  SUNContext sunctx;
  void *cvode_mem;
  sunrealtype t;
  int local_90;
  undefined8 local_80;
  int *local_78;
  sunrealtype *local_70;
  char *local_68;
  double local_60;
  int local_54;
  long local_50;
  UserData local_48;
  void *local_40;
  sunrealtype local_38;
  
  local_40 = (void *)0x0;
  if (argc < 2) {
LAB_00102eeb:
    WrongArgs(*argv);
  }
  pcVar14 = argv[1];
  iVar6 = strcmp(pcVar14,"-nosensi");
  iVar7 = 0;
  if (iVar6 == 0) {
    local_68 = " PARTIAL ERROR CONTROL )";
    local_90 = -1;
    iVar16 = 0;
  }
  else {
    iVar7 = strcmp(pcVar14,"-sensi");
    if ((iVar7 != 0) || (argc != 4)) goto LAB_00102eeb;
    pcVar14 = argv[2];
    iVar7 = strcmp(pcVar14,"sim");
    if (iVar7 == 0) {
      local_90 = 1;
    }
    else {
      iVar7 = strcmp(pcVar14,"stg");
      if (iVar7 == 0) {
        local_90 = 2;
      }
      else {
        iVar7 = strcmp(pcVar14,"stg1");
        local_90 = 3;
        if (iVar7 != 0) goto LAB_00102eeb;
      }
    }
    pcVar14 = argv[3];
    if (*pcVar14 == 'f') {
      local_68 = " PARTIAL ERROR CONTROL )";
      iVar16 = 1;
      iVar7 = 0;
      if (pcVar14[1] != '\0') goto LAB_00102eeb;
    }
    else {
      if ((*pcVar14 != 't') || (pcVar14[1] != '\0')) goto LAB_00102eeb;
      local_68 = " FULL ERROR CONTROL )";
      iVar16 = 1;
      iVar7 = 1;
    }
  }
  local_48 = (UserData)malloc(0x1558);
  papsVar17 = local_48->pivot;
  lVar18 = 0;
  do {
    lVar19 = 0;
    do {
      ppsVar9 = (sunrealtype **)SUNDlsMat_newDenseMat(2,2);
      (*(sunrealtype **(*) [15])(papsVar17 + -0x1e))[lVar19] = ppsVar9;
      ppsVar9 = (sunrealtype **)SUNDlsMat_newDenseMat(2,2);
      (*(sunrealtype **(*) [15])(papsVar17 + -0xf))[lVar19] = ppsVar9;
      psVar10 = (sunindextype *)SUNDlsMat_newIndexArray(2);
      (*papsVar17)[lVar19] = psVar10;
      lVar19 = lVar19 + 1;
    } while (lVar19 != 0xf);
    lVar18 = lVar18 + 1;
    papsVar17 = papsVar17 + 1;
  } while (lVar18 != 0xf);
  psVar11 = (sunrealtype *)malloc(0x40);
  paVar5 = local_48;
  local_48->p = psVar11;
  local_48->om = 7.272205216643056e-05;
  local_48->dx = 1.4285714285714286;
  local_48->dz = 1.4285714285714286;
  local_48->hdco = 1.96e-06;
  local_48->haco = 0.00035;
  local_48->vdco = 4.9e-09;
  *psVar11 = 1.63e-16;
  psVar11[1] = 4.66e-16;
  psVar11[2] = 3.7e+16;
  psVar11[3] = 22.62;
  psVar11[4] = 7.601;
  psVar11[5] = 4e-06;
  *(undefined4 *)(psVar11 + 6) = 0xd2f1a9fc;
  *(undefined4 *)((long)psVar11 + 0x34) = 0x3f50624d;
  *(undefined4 *)(psVar11 + 7) = 0xe2308c3a;
  *(undefined4 *)((long)psVar11 + 0x3c) = 0x3e45798e;
  uVar8 = SUNContext_Create(0,&local_80);
  if ((int)uVar8 < 0) {
    pcVar14 = "SUNContext_Create";
  }
  else {
    y = (N_Vector)N_VNew_Serial(0x1c2);
    if (y == (N_Vector)0x0) {
      main_cold_6();
      return 1;
    }
    local_60 = paVar5->dx;
    dVar1 = paVar5->dz;
    pauVar12 = (undefined1 (*) [16])N_VGetArrayPointer(y);
    lVar18 = 0;
    do {
      dVar20 = ((double)(int)lVar18 * dVar1 + 30.0 + -40.0) * 0.1;
      dVar20 = dVar20 * dVar20;
      dVar20 = dVar20 * dVar20 * 0.5 + (1.0 - dVar20);
      lVar19 = 0;
      pauVar15 = pauVar12;
      do {
        dVar3 = ((double)(int)lVar19 * local_60 + 0.0 + -10.0) * 0.1;
        dVar3 = dVar3 * dVar3;
        dVar3 = dVar3 * dVar3 * 0.5 + (1.0 - dVar3);
        dVar4 = dVar3 * 1000000000000.0 * dVar20;
        auVar2._8_4_ = SUB84(dVar4,0);
        auVar2._0_8_ = dVar3 * 1000000.0 * dVar20;
        auVar2._12_4_ = (int)((ulong)dVar4 >> 0x20);
        *pauVar15 = auVar2;
        lVar19 = lVar19 + 1;
        pauVar15 = pauVar15 + 1;
      } while (lVar19 != 0xf);
      lVar18 = lVar18 + 1;
      pauVar12 = pauVar12 + 0xf;
    } while (lVar18 != 0xf);
    local_54 = iVar16;
    cvode_mem_00 = (void *)CVodeCreate(2,local_80);
    local_40 = cvode_mem_00;
    if (cvode_mem_00 == (void *)0x0) {
      main_cold_5();
      return 1;
    }
    uVar8 = CVodeSetUserData(cvode_mem_00,paVar5);
    if ((int)uVar8 < 0) {
      pcVar14 = "CVodeSetUserData";
    }
    else {
      uVar8 = CVodeSetMaxNumSteps(cvode_mem_00,2000);
      if ((int)uVar8 < 0) {
        pcVar14 = "CVodeSetMaxNumSteps";
      }
      else {
        uVar8 = CVodeInit(0,cvode_mem_00,f,y);
        if ((int)uVar8 < 0) {
          pcVar14 = "CVodeInit";
        }
        else {
          uVar8 = CVodeSStolerances(0x88e368f1,0x3f50624dd2f1a9fc,cvode_mem_00);
          if ((int)uVar8 < 0) {
            pcVar14 = "CVodeSStolerances";
          }
          else {
            lVar18 = SUNLinSol_SPGMR(y,1,0,local_80);
            if (lVar18 == 0) {
              main_cold_4();
              return 1;
            }
            uVar8 = CVodeSetLinearSolver(cvode_mem_00,lVar18,0);
            if ((int)uVar8 < 0) {
              pcVar14 = "CVodeSetLinearSolver";
            }
            else {
              uVar8 = CVodeSetPreconditioner(cvode_mem_00,Precond,PSolve);
              if ((int)uVar8 < 0) {
                pcVar14 = "CVodeSetPreconditioner";
              }
              else {
                puts("\n2-species diurnal advection-diffusion problem");
                local_50 = lVar18;
                if (iVar6 == 0) {
                  local_70 = (sunrealtype *)0x0;
                  pcVar14 = "Sensitivity: NO ";
                  local_78 = (int *)0x0;
                  uS = (N_Vector *)0x0;
LAB_00102bc3:
                  printf(pcVar14);
                  puts("\n");
                  puts("========================================================================");
                  puts("     T     Q       H      NST                    Bottom left  Top right ");
                  puts("========================================================================");
                  dVar1 = 7200.0;
                  iVar16 = 0xc;
                  do {
                    local_60 = dVar1;
                    uVar8 = CVode(cvode_mem_00,y,&local_38,1);
                    if ((int)uVar8 < 0) {
                      pcVar14 = "CVode";
LAB_00102e67:
                      fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar14,
                              (ulong)uVar8);
                      break;
                    }
                    PrintOutput(cvode_mem_00,local_38,y);
                    if (iVar6 != 0) {
                      uVar8 = CVodeGetSens(cvode_mem_00,&local_38,uS);
                      if ((int)uVar8 < 0) {
                        pcVar14 = "CVodeGetSens";
                        goto LAB_00102e67;
                      }
                      PrintOutputS(uS);
                    }
                    puts("------------------------------------------------------------------------")
                    ;
                    dVar1 = local_60 + 7200.0;
                    iVar16 = iVar16 + -1;
                  } while (iVar16 != 0);
                  PrintFinalStats(cvode_mem_00,local_54,iVar7,local_90);
                  N_VDestroy(y);
                  if (iVar6 != 0) {
                    N_VDestroyVectorArray(uS,2);
                    free(local_70);
                    free(local_78);
                  }
                  FreeUserData(local_48);
                  CVodeFree(&local_40);
                  SUNLinSolFree(local_50);
                  SUNContext_Free(&local_80);
                  return 0;
                }
                piVar13 = (int *)malloc(8);
                if (piVar13 == (int *)0x0) {
                  main_cold_3();
                  return 1;
                }
                piVar13[0] = 0;
                piVar13[1] = 1;
                local_70 = (sunrealtype *)malloc(0x10);
                if (local_70 == (sunrealtype *)0x0) {
                  main_cold_2();
                  return 1;
                }
                psVar11 = paVar5->p;
                *local_70 = psVar11[*piVar13];
                local_70[1] = psVar11[piVar13[1]];
                uS = (N_Vector *)N_VCloneVectorArray(2,y);
                if (uS == (N_Vector *)0x0) {
                  main_cold_1();
                  return 1;
                }
                N_VConst(0,*uS);
                N_VConst(0,uS[1]);
                uVar8 = CVodeSensInit1(cvode_mem_00,2,local_90,0,uS);
                if ((int)uVar8 < 0) {
                  pcVar14 = "CVodeSensInit";
                }
                else {
                  uVar8 = CVodeSensEEtolerances(cvode_mem_00);
                  if ((int)uVar8 < 0) {
                    pcVar14 = "CVodeSensEEtolerances";
                  }
                  else {
                    uVar8 = CVodeSetSensErrCon(cvode_mem_00,iVar7);
                    if ((int)uVar8 < 0) {
                      pcVar14 = "CVodeSetSensErrCon";
                    }
                    else {
                      local_78 = piVar13;
                      uVar8 = CVodeSetSensDQMethod(0,cvode_mem_00,1);
                      if ((int)uVar8 < 0) {
                        fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
                                "CVodeSetSensDQMethod",(ulong)uVar8);
                        return 1;
                      }
                      uVar8 = CVodeSetSensParams(cvode_mem_00,paVar5->p,local_70,local_78);
                      if (-1 < (int)uVar8) {
                        printf("Sensitivity: YES ");
                        pcVar14 = "( STAGGERED1 +";
                        if (local_90 == 2) {
                          pcVar14 = "( STAGGERED +";
                        }
                        __format = "( SIMULTANEOUS +";
                        if (local_90 != 1) {
                          __format = pcVar14;
                        }
                        printf(__format);
                        pcVar14 = local_68;
                        goto LAB_00102bc3;
                      }
                      pcVar14 = "CVodeSetSensParams";
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar14,(ulong)uVar8);
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
  SUNContext sunctx;
  void* cvode_mem;
  SUNLinearSolver LS;
  UserData data;
  sunrealtype abstol, reltol, t, tout;
  N_Vector y;
  int iout, retval;

  sunrealtype* pbar;
  int is, *plist;
  N_Vector* uS;
  sunbooleantype sensi, err_con;
  int sensi_meth;

  pbar      = NULL;
  plist     = NULL;
  uS        = NULL;
  y         = NULL;
  data      = NULL;
  cvode_mem = NULL;
  LS        = NULL;

  /* Process arguments */
  ProcessArgs(argc, argv, &sensi, &sensi_meth, &err_con);

  /* Problem parameters */
  data = AllocUserData();
  if (check_retval((void*)data, "AllocUserData", 2)) { return (1); }
  InitUserData(data);

  /* Create the SUNDIALS simulation context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Initial states */
  y = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return (1); }
  SetInitialProfiles(y, data->dx, data->dz);

  /* Tolerances */
  abstol = ATOL;
  reltol = RTOL;

  /* Create CVODES object */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  retval = CVodeSetUserData(cvode_mem, data);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }

  retval = CVodeSetMaxNumSteps(cvode_mem, 2000);
  if (check_retval(&retval, "CVodeSetMaxNumSteps", 1)) { return (1); }

  /* Allocate CVODES memory */
  retval = CVodeInit(cvode_mem, f, T0, y);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  retval = CVodeSStolerances(cvode_mem, reltol, abstol);
  if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }

  /* Create the SUNLinSol_SPGMR linear solver with left
     preconditioning and the default Krylov dimension */
  LS = SUNLinSol_SPGMR(y, SUN_PREC_LEFT, 0, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_SPGMR", 0)) { return (1); }

  /* Attach the linear sovler */
  retval = CVodeSetLinearSolver(cvode_mem, LS, NULL);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return 1; }

  /* Set the preconditioner solve and setup functions */
  retval = CVodeSetPreconditioner(cvode_mem, Precond, PSolve);
  if (check_retval(&retval, "CVodeSetPreconditioner", 1)) { return (1); }

  printf("\n2-species diurnal advection-diffusion problem\n");

  /* Forward sensitivity analysis */
  if (sensi)
  {
    plist = (int*)malloc(NS * sizeof(int));
    if (check_retval((void*)plist, "malloc", 2)) { return (1); }
    for (is = 0; is < NS; is++) { plist[is] = is; }

    pbar = (sunrealtype*)malloc(NS * sizeof(sunrealtype));
    if (check_retval((void*)pbar, "malloc", 2)) { return (1); }
    for (is = 0; is < NS; is++) { pbar[is] = data->p[plist[is]]; }

    uS = N_VCloneVectorArray(NS, y);
    if (check_retval((void*)uS, "N_VCloneVectorArray", 0)) { return (1); }
    for (is = 0; is < NS; is++) { N_VConst(ZERO, uS[is]); }

    retval = CVodeSensInit1(cvode_mem, NS, sensi_meth, NULL, uS);
    if (check_retval(&retval, "CVodeSensInit", 1)) { return (1); }

    retval = CVodeSensEEtolerances(cvode_mem);
    if (check_retval(&retval, "CVodeSensEEtolerances", 1)) { return (1); }

    retval = CVodeSetSensErrCon(cvode_mem, err_con);
    if (check_retval(&retval, "CVodeSetSensErrCon", 1)) { return (1); }

    retval = CVodeSetSensDQMethod(cvode_mem, CV_CENTERED, ZERO);
    if (check_retval(&retval, "CVodeSetSensDQMethod", 1)) { return (1); }

    retval = CVodeSetSensParams(cvode_mem, data->p, pbar, plist);
    if (check_retval(&retval, "CVodeSetSensParams", 1)) { return (1); }

    printf("Sensitivity: YES ");
    if (sensi_meth == CV_SIMULTANEOUS) { printf("( SIMULTANEOUS +"); }
    else if (sensi_meth == CV_STAGGERED) { printf("( STAGGERED +"); }
    else { printf("( STAGGERED1 +"); }
    if (err_con) { printf(" FULL ERROR CONTROL )"); }
    else { printf(" PARTIAL ERROR CONTROL )"); }
  }
  else { printf("Sensitivity: NO "); }

  /* In loop over output points, call CVode, print results, test for error */

  printf("\n\n");
  printf("====================================================================="
         "===\n");
  printf("     T     Q       H      NST                    Bottom left  Top "
         "right \n");
  printf("====================================================================="
         "===\n");

  for (iout = 1, tout = TWOHR; iout <= NOUT; iout++, tout += TWOHR)
  {
    retval = CVode(cvode_mem, tout, y, &t, CV_NORMAL);
    if (check_retval(&retval, "CVode", 1)) { break; }
    PrintOutput(cvode_mem, t, y);
    if (sensi)
    {
      retval = CVodeGetSens(cvode_mem, &t, uS);
      if (check_retval(&retval, "CVodeGetSens", 1)) { break; }
      PrintOutputS(uS);
    }

    printf("-------------------------------------------------------------------"
           "-----\n");
  }

  /* Print final statistics */
  PrintFinalStats(cvode_mem, sensi, err_con, sensi_meth);

  /* Free memory */
  N_VDestroy(y);
  if (sensi)
  {
    N_VDestroyVectorArray(uS, NS);
    free(pbar);
    free(plist);
  }
  FreeUserData(data);
  CVodeFree(&cvode_mem);
  SUNLinSolFree(LS);
  SUNContext_Free(&sunctx);

  return (0);
}